

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void drawSceneNodeRecursive(cgltf_node *node,mat4 *viewProj,mat4 *parentMat)

{
  uint uVar1;
  GLuint GVar2;
  cgltf_skin *pcVar3;
  cgltf_node *pcVar4;
  cgltf_node *pcVar5;
  cgltf_mesh *pcVar6;
  cgltf_texture *pcVar7;
  cgltf_node **ppcVar8;
  uint skinning;
  PFNGLBINDTEXTUREPROC p_Var9;
  PFNGLDRAWARRAYSPROC p_Var10;
  PFNGLDRAWELEMENTSPROC p_Var11;
  PFNGLUNIFORM4FVPROC p_Var12;
  GLenum GVar13;
  GLenum GVar14;
  glm *this;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar15;
  mat<4,_4,_float,_(glm::qualifier)0> *m2;
  uint *puVar16;
  cgltf_primitive *pcVar17;
  ShaderData *pSVar18;
  mat<4,_4,_float,_(glm::qualifier)0> *m;
  mat<4,_4,_float,_(glm::qualifier)0> *extraout_RDX;
  mat<4,_4,_float,_(glm::qualifier)0> *extraout_RDX_00;
  mat<4,_4,_float,_(glm::qualifier)0> *extraout_RDX_01;
  mat4 *extraout_RDX_02;
  ulong uVar19;
  cgltf_material *pcVar20;
  uint uVar21;
  size_t i;
  cgltf_size cVar22;
  ulong i_00;
  mat4 *pmVar23;
  long lVar24;
  GLsizei local_1118;
  mat3 modelMat3;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_10d4;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_10d0;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_10cc;
  col_type local_10c8;
  CSpan<cgltf_primitive> primitives;
  mat4 modelViewProj;
  mat4 jointMatrices [64];
  
  this = (glm *)tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::operator[]
                          ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)anims::nodesMatrices
                           ,(long)(int)(((long)node - (long)parsedData->nodes) / 0xd8));
  pmVar15 = m;
  if (node->mesh != (cgltf_mesh *)0x0) {
    pcVar3 = node->skin;
    if (pcVar3 == (cgltf_skin *)0x0) {
      local_1118 = 0;
    }
    else {
      cVar22 = pcVar3->joints_count;
      glm::affineInverse<float,(glm::qualifier)0>(&modelViewProj,this,m);
      local_1118 = (GLsizei)cVar22;
      pmVar23 = jointMatrices;
      for (cVar22 = 0; (long)local_1118 != cVar22; cVar22 = cVar22 + 1) {
        pcVar4 = node->skin->joints[cVar22];
        pcVar5 = parsedData->nodes;
        pmVar15 = (mat<4,_4,_float,_(glm::qualifier)0> *)
                  cgltfAccessAccessor(node->skin->inverse_bind_matrices,cVar22);
        m2 = tl::Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::operator[]
                       ((Vector<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)anims::nodesMatrices,
                        ((long)pcVar4 - (long)pcVar5) / 0xd8);
        glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&primitives,&modelViewProj,m2);
        glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)&modelMat3,
                       (mat<4,_4,_float,_(glm::qualifier)0> *)&primitives,pmVar15);
        pmVar23->value[3].field_0 = local_10c8.field_0;
        pmVar23->value[3].field_1 = local_10c8.field_1;
        pmVar23->value[3].field_2 = local_10c8.field_2;
        pmVar23->value[3].field_3 = local_10c8.field_3;
        pmVar23->value[2].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
             modelMat3.value[2].field_2;
        pmVar23->value[2].field_1 = aStack_10d4;
        pmVar23->value[2].field_2 = aStack_10d0;
        pmVar23->value[2].field_3 = aStack_10cc;
        pmVar23->value[1].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
             modelMat3.value[1].field_1;
        pmVar23->value[1].field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
             modelMat3.value[1].field_2;
        pmVar23->value[1].field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
             modelMat3.value[2].field_0;
        pmVar23->value[1].field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
             modelMat3.value[2].field_1;
        pmVar23->value[0].field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)
             modelMat3.value[0].field_0;
        pmVar23->value[0].field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)
             modelMat3.value[0].field_1;
        pmVar23->value[0].field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
             modelMat3.value[0].field_2;
        pmVar23->value[0].field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
             modelMat3.value[1].field_0;
        pmVar23 = pmVar23 + 1;
      }
    }
    skinning = (uint)(pcVar3 != (cgltf_skin *)0x0);
    glm::mat<3,_3,_float,_(glm::qualifier)0>::mat
              (&modelMat3,(mat<4,_4,_float,_(glm::qualifier)0> *)this);
    glm::operator*(&modelViewProj,viewProj,(mat<4,_4,_float,_(glm::qualifier)0> *)this);
    pcVar6 = node->mesh;
    primitives._data = pcVar6->primitives;
    uVar19 = pcVar6->primitives_count;
    primitives._size = uVar19;
    puVar16 = tl::FVector<unsigned_int,_1024UL>::operator[]
                        ((FVector<unsigned_int,_1024UL> *)gpu::meshPrimsVaos,
                         ((long)pcVar6 - (long)parsedData->meshes) / 0x48);
    uVar1 = *puVar16;
    pmVar15 = extraout_RDX;
    for (i_00 = 0; i_00 < uVar19; i_00 = i_00 + 1) {
      pcVar17 = tl::Span<const_cgltf_primitive>::operator[](&primitives,i_00);
      pcVar20 = pcVar17->material;
      if (pcVar20 == (cgltf_material *)0x0) {
        pcVar20 = &s_defaultMaterial;
      }
      if (pcVar20->has_pbr_metallic_roughness == 0) {
        __assert_fail("false && \"type of material not supported\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                      ,0x37a,
                      "void drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)"
                     );
      }
      GVar2 = *(GLuint *)(gpu::vaos + i_00 * 4 + (ulong)uVar1 * 4);
      pSVar18 = gpu::shaderPbrMetallic(skinning);
      (*glad_debug_glUseProgram)(pSVar18->prog);
      (*glad_debug_glUniformMatrix4fv)
                ((pSVar18->unifLocs).modelViewProj,1,'\0',(GLfloat *)&modelViewProj);
      (*glad_debug_glUniformMatrix3fv)((pSVar18->unifLocs).modelMat3,1,'\0',(GLfloat *)&modelMat3);
      if (pcVar3 != (cgltf_skin *)0x0) {
        (*glad_debug_glUniformMatrix4fv)
                  ((pSVar18->unifLocs).jointMatrices,local_1118,'\0',(GLfloat *)jointMatrices);
      }
      (*glad_debug_glActiveTexture)(0x84c0);
      p_Var12 = glad_debug_glUniform4fv;
      if (pcVar20->has_pbr_metallic_roughness == 0) {
        if (pcVar20->has_pbr_specular_glossiness != 0) {
          __assert_fail("\"todo\" && false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                        ,0x354,
                        "auto drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)::(anonymous class)::operator()() const"
                       );
        }
      }
      else {
        pSVar18 = gpu::shaderPbrMetallic(skinning);
        (*p_Var12)((pSVar18->unifLocs).color,1,(pcVar20->pbr_metallic_roughness).base_color_factor);
        p_Var9 = glad_debug_glBindTexture;
        pcVar7 = (pcVar20->pbr_metallic_roughness).base_color_texture.texture;
        puVar16 = &gpu::whiteTexture;
        if (pcVar7 != (cgltf_texture *)0x0) {
          puVar16 = tl::FVector<unsigned_int,_128UL>::operator[]
                              ((FVector<unsigned_int,_128UL> *)gpu::textures,
                               ((long)pcVar7 - (long)parsedData->textures) / 0x28);
        }
        (*p_Var9)(0xde1,*puVar16);
      }
      (*glad_debug_glActiveTexture)(0x84c1);
      p_Var9 = glad_debug_glBindTexture;
      pcVar7 = (pcVar20->normal_texture).texture;
      if (pcVar7 == (cgltf_texture *)0x0) {
        uVar21 = 0;
      }
      else {
        puVar16 = tl::FVector<unsigned_int,_128UL>::operator[]
                            ((FVector<unsigned_int,_128UL> *)gpu::textures,
                             ((long)pcVar7 - (long)parsedData->textures) / 0x28);
        uVar21 = *puVar16;
      }
      (*p_Var9)(0xde1,uVar21);
      (*glad_debug_glBindVertexArray)(GVar2);
      p_Var11 = glad_debug_glDrawElements;
      p_Var10 = glad_debug_glDrawArrays;
      if (pcVar17->indices == (cgltf_accessor *)0x0) {
        GVar13 = cgltfPrimTypeToGl(pcVar17->type);
        (*p_Var10)(GVar13,0,(GLsizei)pcVar17->attributes->data->count);
        pmVar15 = extraout_RDX_01;
      }
      else {
        GVar13 = cgltfPrimTypeToGl(pcVar17->type);
        cVar22 = pcVar17->indices->count;
        GVar14 = cgltfComponentTypeToGl(pcVar17->indices->component_type);
        (*p_Var11)(GVar13,(GLsizei)cVar22,GVar14,
                   (void *)(pcVar17->indices->offset + pcVar17->indices->buffer_view->offset));
        pmVar15 = extraout_RDX_00;
      }
      uVar19 = primitives._size;
    }
  }
  ppcVar8 = node->children;
  cVar22 = node->children_count;
  lVar24 = 0;
  while( true ) {
    if (cVar22 << 3 == lVar24) {
      return;
    }
    pcVar4 = *(cgltf_node **)((long)ppcVar8 + lVar24);
    if (pcVar4 == (cgltf_node *)0x0) break;
    drawSceneNodeRecursive(pcVar4,viewProj,pmVar15);
    lVar24 = lVar24 + 8;
    pmVar15 = extraout_RDX_02;
  }
  __assert_fail("child",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/scene.cpp"
                ,0x381,
                "void drawSceneNodeRecursive(const cgltf_node &, const glm::mat4 &, const glm::mat4 &)"
               );
}

Assistant:

static void drawSceneNodeRecursive(const cgltf_node& node, const glm::mat4& viewProj,
    const glm::mat4& parentMat = glm::mat4(1.0))
{
    const i32 nodeInd = getNodeInd(&node);
    const glm::mat4& modelMat = anims::nodesMatrices[nodeInd];

    if(node.mesh)
    {
        const int skinning = node.skin ? 1 : 0;
        int numJoints = 0;
        glm::mat4 jointMatrices[MAX_NUM_JOINTS];
        if(node.skin) {
            numJoints = node.skin->joints_count;
            const glm::mat4 modelMatInv = glm::affineInverse(modelMat);
            for(size_t i = 0; i < numJoints; i++) {
                const cgltf_node& joint = *node.skin->joints[i];
                const size_t jointNodeInd = getNodeInd(&joint);
                const glm::mat4& invBindMtx = *(const glm::mat4*)cgltfAccessAccessor(*node.skin->inverse_bind_matrices, i);
                jointMatrices[i] =
                    modelMatInv *
                    anims::nodesMatrices[jointNodeInd] *
                    invBindMtx;
            }
        }

        const glm::mat3 modelMat3 = modelMat;
        const glm::mat4 modelViewProj = viewProj * modelMat;
        CSpan<cgltf_primitive> primitives(node.mesh->primitives, node.mesh->primitives_count);
        const u32* vaos = gpu::vaos.begin() + gpu::meshPrimsVaos[getMeshInd(node.mesh)];
        for(size_t i = 0; i < primitives.size(); i++)
        {
            const cgltf_primitive& prim = primitives[i];
            const u32 vao = vaos[i];
            const auto& material = prim.material ? *prim.material : s_defaultMaterial;

            auto draw = [&]
            {
                glActiveTexture(GL_TEXTURE0 + (u32)ETexUnit::ALBEDO);
                if(material.has_pbr_metallic_roughness) {
                    glUniform4fv(gpu::shaderPbrMetallic(skinning).unifLocs.color,
                                 1, material.pbr_metallic_roughness.base_color_factor);
                    if(auto tex = material.pbr_metallic_roughness.base_color_texture.texture)
                        glBindTexture(GL_TEXTURE_2D, gpu::textures[getTextureInd(tex)]);
                    else
                        glBindTexture(GL_TEXTURE_2D, gpu::whiteTexture);
                }
                else if(material.has_pbr_specular_glossiness) {
                    assert("todo" && false);
                }

                glActiveTexture(GL_TEXTURE0 + (u32)ETexUnit::NORMAL);
                if(auto tex = material.normal_texture.texture)
                    glBindTexture(GL_TEXTURE_2D, gpu::textures[getTextureInd(tex)]);
                else
                    glBindTexture(GL_TEXTURE_2D, gpu::blueTexture);

                glBindVertexArray(vao);
                if(prim.indices) {
                    glDrawElements(
                       cgltfPrimTypeToGl(prim.type),
                       prim.indices->count,
                       cgltfComponentTypeToGl(prim.indices->component_type),
                       (void*)(prim.indices->buffer_view->offset + prim.indices->offset)
                    );
                }
                else {
                    glDrawArrays(cgltfPrimTypeToGl(prim.type), 0, prim.attributes->data->count);
                }
            };
            auto uploadCommonUniforms = [&](const ShaderData& shader)
            {
                glUniformMatrix4fv(shader.unifLocs.modelViewProj, 1, GL_FALSE, &modelViewProj[0][0]);
                glUniformMatrix3fv(shader.unifLocs.modelMat3, 1, GL_FALSE, &modelMat3[0][0]);
                if(skinning)
                    glUniformMatrix4fv(shader.unifLocs.jointMatrices, numJoints, GL_FALSE, &jointMatrices[0][0][0]);
            };

            if(material.has_pbr_metallic_roughness)
            {
                auto& shader = gpu::shaderPbrMetallic(skinning);
                glUseProgram(shader.prog);
                uploadCommonUniforms(shader);
                draw();
            }
            else {
                assert(false && "type of material not supported");
            }
        }
    }

    CSpan<cgltf_node*> children(node.children, node.children_count);
    for(cgltf_node* child : children) {
        assert(child);
        drawSceneNodeRecursive(*child, viewProj, modelMat);
    }
}